

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

Pdr_Set_t * Pdr_SetCreate(Vec_Int_t *vLits,Vec_Int_t *vPiLits)

{
  int iVar1;
  undefined4 uVar2;
  int *piVar3;
  Pdr_Set_t *pPVar4;
  word wVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Pdr_Set_t *pPVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar7 = vLits->nSize;
  uVar11 = (ulong)uVar7;
  iVar1 = vPiLits->nSize;
  iVar8 = iVar1 + uVar7;
  if (0x3fffffff < iVar8) {
    __assert_fail("Vec_IntSize(vLits) + Vec_IntSize(vPiLits) < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrUtil.c"
                  ,0x45,"Pdr_Set_t *Pdr_SetCreate(Vec_Int_t *, Vec_Int_t *)");
  }
  pPVar4 = (Pdr_Set_t *)malloc((long)iVar8 * 4 + 0x18);
  pPVar4->nLits = uVar7;
  pPVar4->nTotal = iVar8;
  pPVar4->nRefs = 1;
  pPVar4->Sign = 0;
  if (0 < (int)uVar7) {
    piVar3 = vLits->pArray;
    wVar5 = pPVar4->Sign;
    uVar9 = 0;
    do {
      if (uVar11 == uVar9) {
        pPVar4->Sign = wVar5;
        goto LAB_005f42e2;
      }
      iVar8 = piVar3[uVar9];
      *(int *)(&pPVar4->field_0x14 + uVar9 * 4) = iVar8;
      wVar5 = wVar5 | 1L << ((ulong)(uint)(iVar8 % 0x3f) & 0x3f);
      uVar9 = uVar9 + 1;
      uVar7 = pPVar4->nLits;
    } while ((long)uVar9 < (long)(int)uVar7);
    pPVar4->Sign = wVar5;
  }
  if (1 < (int)uVar7) {
    uVar9 = (ulong)uVar7;
    pPVar10 = pPVar4 + 1;
    iVar8 = 1;
    uVar11 = 0;
    do {
      uVar9 = uVar9 - 1;
      uVar12 = 0;
      uVar13 = uVar11 & 0xffffffff;
      do {
        if (*(int *)((long)&pPVar10->Sign + uVar12 * 4) <
            *(int *)(&pPVar4->field_0x14 + (long)(int)uVar13 * 4)) {
          uVar13 = (ulong)(uint)(iVar8 + (int)uVar12);
        }
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
      uVar2 = *(undefined4 *)(&pPVar4->field_0x14 + uVar11 * 4);
      *(undefined4 *)(&pPVar4->field_0x14 + uVar11 * 4) =
           *(undefined4 *)(&pPVar4->field_0x14 + (long)(int)uVar13 * 4);
      uVar11 = uVar11 + 1;
      *(undefined4 *)(&pPVar4->field_0x14 + (long)(int)uVar13 * 4) = uVar2;
      iVar8 = iVar8 + 1;
      pPVar10 = (Pdr_Set_t *)((long)&pPVar10->Sign + 4);
    } while (uVar11 != uVar7 - 1);
  }
  lVar6 = (long)pPVar4->nLits;
  if (pPVar4->nLits < pPVar4->nTotal) {
    do {
      uVar7 = (int)lVar6 - pPVar4->nLits;
      if (((int)uVar7 < 0) || (iVar1 <= (int)uVar7)) {
LAB_005f42e2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      *(int *)(&pPVar4->field_0x14 + lVar6 * 4) = vPiLits->pArray[uVar7];
      lVar6 = lVar6 + 1;
    } while (lVar6 < pPVar4->nTotal);
  }
  return pPVar4;
}

Assistant:

Pdr_Set_t * Pdr_SetCreate( Vec_Int_t * vLits, Vec_Int_t * vPiLits )
{
    Pdr_Set_t * p;
    int i;
    assert( Vec_IntSize(vLits) + Vec_IntSize(vPiLits) < (1<<30) );
    p = (Pdr_Set_t *)ABC_ALLOC( char, sizeof(Pdr_Set_t) + (Vec_IntSize(vLits) + Vec_IntSize(vPiLits)) * sizeof(int) );
    p->nLits  = Vec_IntSize(vLits);
    p->nTotal = Vec_IntSize(vLits) + Vec_IntSize(vPiLits);
    p->nRefs  = 1;
    p->Sign   = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        p->Lits[i] = Vec_IntEntry(vLits, i);
        p->Sign   |= ((word)1 << (p->Lits[i] % 63));
    }
    Vec_IntSelectSort( p->Lits, p->nLits );
    // remember PI literals 
    for ( i = p->nLits; i < p->nTotal; i++ )
        p->Lits[i] = Vec_IntEntry(vPiLits, i-p->nLits);
    return p;
}